

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O3

bool __thiscall fast_float::bigint::pow5(bigint *this,uint32_t exp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  size_t in_RCX;
  ushort uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t index;
  ulong uVar10;
  ulong uVar11;
  limb_span y;
  
  if (0x86 < exp) {
    do {
      y.length = in_RCX;
      y.ptr = (unsigned_long *)0x5;
      bVar6 = large_mul<(unsigned_short)62>
                        ((fast_float *)this,(stackvec<(unsigned_short)62> *)pow5::large_power_of_5,y
                        );
      if (!bVar6) goto LAB_00138bb4;
      exp = exp - 0x87;
    } while (0x86 < exp);
  }
  if (0x1a < exp) {
    uVar7 = (this->vec).length;
    do {
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar10 = 0;
        uVar8 = 0;
        do {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar8;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (this->vec).data[uVar10];
          auVar4 = ZEXT816(0x6765c793fa10079d) * auVar2 + auVar4;
          uVar8 = auVar4._8_8_;
          (this->vec).data[uVar10] = auVar4._0_8_;
          uVar10 = uVar10 + 1;
        } while (uVar7 != uVar10);
        if (uVar8 != 0) {
          if (0x3d < uVar7) goto LAB_00138bb4;
          (this->vec).data[uVar7] = uVar8;
          uVar7 = uVar7 + 1;
          (this->vec).length = uVar7;
        }
      }
      exp = exp - 0x1b;
    } while (0x1a < exp);
  }
  bVar6 = true;
  if (exp != 0) {
    uVar7 = (this->vec).length;
    uVar8 = (ulong)uVar7;
    if (uVar8 != 0) {
      uVar10 = pow5::small_power_of_5[exp];
      uVar11 = 0;
      uVar9 = 0;
      do {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar9;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar10;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (this->vec).data[uVar11];
        auVar5 = auVar1 * auVar3 + auVar5;
        uVar9 = auVar5._8_8_;
        (this->vec).data[uVar11] = auVar5._0_8_;
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
      if (uVar9 != 0) {
        if (uVar7 < 0x3e) {
          (this->vec).data[uVar8] = uVar9;
          (this->vec).length = uVar7 + 1;
        }
        else {
LAB_00138bb4:
          bVar6 = false;
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool pow5(uint32_t exp) noexcept {
    // multiply by a power of 5
    static constexpr uint32_t large_step = 135;
    static constexpr uint64_t small_power_of_5[] = {
      1UL, 5UL, 25UL, 125UL, 625UL, 3125UL, 15625UL, 78125UL, 390625UL,
      1953125UL, 9765625UL, 48828125UL, 244140625UL, 1220703125UL,
      6103515625UL, 30517578125UL, 152587890625UL, 762939453125UL,
      3814697265625UL, 19073486328125UL, 95367431640625UL, 476837158203125UL,
      2384185791015625UL, 11920928955078125UL, 59604644775390625UL,
      298023223876953125UL, 1490116119384765625UL, 7450580596923828125UL,
    };
#ifdef FASTFLOAT_64BIT_LIMB
    constexpr static limb large_power_of_5[] = {
      1414648277510068013UL, 9180637584431281687UL, 4539964771860779200UL,
      10482974169319127550UL, 198276706040285095UL};
#else
    constexpr static limb large_power_of_5[] = {
      4279965485U, 329373468U, 4020270615U, 2137533757U, 4287402176U,
      1057042919U, 1071430142U, 2440757623U, 381945767U, 46164893U};
#endif
    size_t large_length = sizeof(large_power_of_5) / sizeof(limb);
    limb_span large = limb_span(large_power_of_5, large_length);
    while (exp >= large_step) {
      FASTFLOAT_TRY(large_mul(vec, large));
      exp -= large_step;
    }
#ifdef FASTFLOAT_64BIT_LIMB
    uint32_t small_step = 27;
    limb max_native = 7450580596923828125UL;
#else
    uint32_t small_step = 13;
    limb max_native = 1220703125U;
#endif
    while (exp >= small_step) {
      FASTFLOAT_TRY(small_mul(vec, max_native));
      exp -= small_step;
    }
    if (exp != 0) {
      FASTFLOAT_TRY(small_mul(vec, limb(small_power_of_5[exp])));
    }

    return true;
  }